

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svc_layercontext.c
# Opt level: O0

void av1_svc_update_buffer_slot_refreshed(AV1_COMP *cpi)

{
  int iVar1;
  AV1_PRIMARY *pAVar2;
  uint local_2c;
  int ref_frame_map_idx;
  uint i_1;
  uint i;
  uint current_frame;
  RTC_REF *rtc_ref;
  SVC *svc;
  AV1_COMP *cpi_local;
  
  pAVar2 = cpi->ppi;
  if (cpi->ppi->use_svc == 0) {
    local_2c = (cpi->common).current_frame.frame_number;
  }
  else {
    local_2c = (cpi->svc).current_superframe;
  }
  if ((cpi->common).current_frame.frame_type == '\0') {
    for (i = 0; i < 8; i = i + 1) {
      (pAVar2->rtc_ref).buffer_time_index[i] = local_2c;
      (pAVar2->rtc_ref).buffer_spatial_layer[i] = (uchar)(cpi->svc).spatial_layer_id;
    }
  }
  else if ((pAVar2->rtc_ref).set_ref_frame_config != 0) {
    for (i_1 = 0; i_1 < 7; i_1 = i_1 + 1) {
      iVar1 = (pAVar2->rtc_ref).ref_idx[i_1];
      if ((pAVar2->rtc_ref).refresh[iVar1] != 0) {
        (pAVar2->rtc_ref).buffer_time_index[iVar1] = local_2c;
        (pAVar2->rtc_ref).buffer_spatial_layer[iVar1] = (uchar)(cpi->svc).spatial_layer_id;
      }
    }
  }
  return;
}

Assistant:

void av1_svc_update_buffer_slot_refreshed(AV1_COMP *const cpi) {
  SVC *const svc = &cpi->svc;
  RTC_REF *const rtc_ref = &cpi->ppi->rtc_ref;
  const unsigned int current_frame =
      cpi->ppi->use_svc ? svc->current_superframe
                        : cpi->common.current_frame.frame_number;
  // For any buffer slot that is refreshed, update it with
  // the spatial_layer_id and the current_superframe.
  if (cpi->common.current_frame.frame_type == KEY_FRAME) {
    // All slots are refreshed on KEY.
    for (unsigned int i = 0; i < REF_FRAMES; i++) {
      rtc_ref->buffer_time_index[i] = current_frame;
      rtc_ref->buffer_spatial_layer[i] = svc->spatial_layer_id;
    }
  } else if (rtc_ref->set_ref_frame_config) {
    for (unsigned int i = 0; i < INTER_REFS_PER_FRAME; i++) {
      const int ref_frame_map_idx = rtc_ref->ref_idx[i];
      if (rtc_ref->refresh[ref_frame_map_idx]) {
        rtc_ref->buffer_time_index[ref_frame_map_idx] = current_frame;
        rtc_ref->buffer_spatial_layer[ref_frame_map_idx] =
            svc->spatial_layer_id;
      }
    }
  }
}